

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

void HN::parsePoll(ItemData *data,Poll *res)

{
  int iVar1;
  mapped_type *pmVar2;
  uint64_t uVar3;
  allocator<char> local_99;
  key_type local_98;
  key_type local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"by",(allocator<char> *)&local_78);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(data,&local_98);
  std::__cxx11::string::_M_assign((string *)res);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"descendants",(allocator<char> *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  iVar1 = std::__cxx11::stoi(pmVar2,(size_t *)0x0,10);
  res->descendants = iVar1;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"id",(allocator<char> *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  iVar1 = std::__cxx11::stoi(pmVar2,(size_t *)0x0,10);
  res->id = iVar1;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"kids",&local_99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  JSON::parseIntArray((vector<int,_std::allocator<int>_> *)&local_78,pmVar2);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&res->kids,&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"parts",&local_99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  JSON::parseIntArray((vector<int,_std::allocator<int>_> *)&local_78,pmVar2);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&res->parts,&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"score",(allocator<char> *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  iVar1 = std::__cxx11::stoi(pmVar2,(size_t *)0x0,10);
  res->score = iVar1;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"time",(allocator<char> *)&local_78);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_98);
  uVar3 = std::__cxx11::stoll(pmVar2,(size_t *)0x0,10);
  res->time = uVar3;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"text",&local_99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_78);
  std::__cxx11::string::string((string *)&local_38,(string *)pmVar2);
  parseHTML(&local_98,&local_38);
  std::__cxx11::string::operator=((string *)&res->text,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"title",&local_99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(data,&local_78);
  std::__cxx11::string::string((string *)&local_58,(string *)pmVar2);
  parseHTML(&local_98,&local_58);
  std::__cxx11::string::operator=((string *)&res->title,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void parsePoll(const ItemData & data, Poll & res) {
        try {
            res.by = data.at("by");
        } catch (...) {
            res.by = "[deleted]";
        }
        try {
            res.descendants = std::stoi(data.at("descendants"));
        } catch (...) {
            res.descendants = 0;
        }
        try {
            res.id = std::stoi(data.at("id"));
        } catch (...) {
            res.id = 0;
        }
        try {
            res.kids = JSON::parseIntArray(data.at("kids"));
        } catch (...) {
            res.kids.clear();
        }
        try {
            res.parts = JSON::parseIntArray(data.at("parts"));
        } catch (...) {
            res.parts.clear();
        }
        try {
            res.score = std::stoi(data.at("score"));
        } catch (...) {
            res.score = 0;
        }
        try {
            res.time = std::stoll(data.at("time"));
        } catch (...) {
            res.time = 0;
        }
        try {
            res.text = parseHTML(data.at("text"));
        } catch (...) {
            res.text = "";
        }
        try {
            res.title = parseHTML(data.at("title"));
        } catch (...) {
            res.title = "";
        }
    }